

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip-test.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_0::MockAsyncInputStream::tryRead
          (MockAsyncInputStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  PromiseNode *extraout_RDX;
  ulong in_R8;
  ulong __n;
  Promise<unsigned_long> PVar1;
  
  __n = *(ulong *)((long)buffer + 0x18);
  if (in_R8 <= *(ulong *)((long)buffer + 0x18)) {
    __n = in_R8;
  }
  if (__n <= maxBytes) {
    __n = maxBytes;
  }
  if (*(ulong *)((long)buffer + 0x10) <= __n) {
    __n = *(ulong *)((long)buffer + 0x10);
  }
  memcpy((void *)minBytes,*(void **)((long)buffer + 8),__n);
  *(long *)((long)buffer + 8) = *(long *)((long)buffer + 8) + __n;
  *(long *)((long)buffer + 0x10) = *(long *)((long)buffer + 0x10) - __n;
  Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,__n);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    // Clamp max read to blockSize.
    size_t n = kj::min(blockSize, maxBytes);

    // Unless that's less than minBytes -- in which case, use minBytes.
    n = kj::max(n, minBytes);

    // But also don't read more data than we have.
    n = kj::min(n, bytes.size());

    memcpy(buffer, bytes.begin(), n);
    bytes = bytes.slice(n, bytes.size());
    return n;
  }